

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockingqueue.hpp
# Opt level: O0

function<void_()> * __thiscall
BlockingQueue<std::function<void_()>_>::pop(BlockingQueue<std::function<void_()>_> *this)

{
  reference __x;
  anon_class_8_1_8991fb9c in_RSI;
  Item *in_RDI;
  Item item;
  unique_lock<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffff78;
  Item *this_00;
  ulong local_40;
  
  this_00 = in_RDI;
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)in_RDI,in_stack_ffffffffffffff78);
  std::condition_variable::wait<BlockingQueue<std::function<void()>>::pop()::_lambda()_1_>
            ((condition_variable *)this_00,(unique_lock<std::mutex> *)in_RDI,in_RSI);
  __x = std::
        queue<BlockingQueue<std::function<void_()>_>::Item,_std::deque<BlockingQueue<std::function<void_()>_>::Item,_std::allocator<BlockingQueue<std::function<void_()>_>::Item>_>_>
        ::front((queue<BlockingQueue<std::function<void_()>_>::Item,_std::deque<BlockingQueue<std::function<void_()>_>::Item,_std::allocator<BlockingQueue<std::function<void_()>_>::Item>_>_>
                 *)0x15cd4d);
  Item::Item(in_RDI,__x);
  std::
  queue<BlockingQueue<std::function<void_()>_>::Item,_std::deque<BlockingQueue<std::function<void_()>_>::Item,_std::allocator<BlockingQueue<std::function<void_()>_>::Item>_>_>
  ::pop((queue<BlockingQueue<std::function<void_()>_>::Item,_std::deque<BlockingQueue<std::function<void_()>_>::Item,_std::allocator<BlockingQueue<std::function<void_()>_>::Item>_>_>
         *)0x15cd72);
  if (local_40 != 0) {
    if ((in_RSI.this)->totalSize < local_40) {
      __assert_fail("totalSize >= item.size",
                    "/workspace/llm4binary/github/license_c_cmakelists/zeux[P]qgrep/src/blockingqueue.hpp"
                    ,0x2e,
                    "T BlockingQueue<std::function<void ()>>::pop() [T = std::function<void ()>]");
    }
    (in_RSI.this)->totalSize = (in_RSI.this)->totalSize - local_40;
    std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)in_RDI);
    std::condition_variable::notify_all();
  }
  std::function<void_()>::function(&in_RDI->value,&__x->value);
  Item::~Item((Item *)0x15ce2c);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)in_RDI);
  return &this_00->value;
}

Assistant:

T pop()
	{
		std::unique_lock<std::mutex> lock(mutex);

		itemsNotEmpty.wait(lock, [&]() { return !items.empty(); });

		Item item = std::move(items.front());
		items.pop();

		if (item.size > 0)
		{
			assert(totalSize >= item.size);
			totalSize -= item.size;

			lock.unlock();
			itemsNotFull.notify_all();
		}

		return std::move(item.value);
	}